

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSString * js_alloc_string(JSContext *ctx,int max_len,int is_wide_char)

{
  JSString *p;
  undefined1 in_stack_ffffffffffffffd0 [16];
  JSString *local_8;
  
  local_8 = js_alloc_string_rt(in_stack_ffffffffffffffd0._8_8_,in_stack_ffffffffffffffd0._4_4_,
                               in_stack_ffffffffffffffd0._0_4_);
  if (local_8 == (JSString *)0x0) {
    JS_ThrowOutOfMemory((JSContext *)0x0);
    local_8 = (JSString *)0x0;
  }
  return local_8;
}

Assistant:

static JSString *js_alloc_string(JSContext *ctx, int max_len, int is_wide_char)
{
    JSString *p;
    p = js_alloc_string_rt(ctx->rt, max_len, is_wide_char);
    if (unlikely(!p)) {
        JS_ThrowOutOfMemory(ctx);
        return NULL;
    }
    return p;
}